

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

uint32 __thiscall Clasp::Solver::analyzeConflict(Solver *this)

{
  ulong uVar1;
  int iVar2;
  bool bVar3;
  size_type sVar4;
  uint32 uVar5;
  Solver *this_00;
  reference pDVar6;
  DecisionHeuristic *pDVar7;
  Literal *pLVar8;
  Antecedent *pAVar9;
  reference pLVar10;
  Constraint *pCVar11;
  long in_RDI;
  ClauseHead *in_stack_00000008;
  ConstraintInfo *in_stack_00000010;
  LitVec *in_stack_00000018;
  Solver *in_stack_00000020;
  ClauseHead *lastRes;
  uint32 cl;
  Literal *q;
  size_type i;
  uint32 rhsSize;
  uint32 lhsSize;
  bool doOtfs;
  Antecedent last;
  Antecedent rhs;
  Antecedent lhs;
  Literal p;
  uint32 resSize;
  uint32 onLevel;
  Solver *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  Literal in_stack_ffffffffffffff44;
  pair<Clasp::Literal,_int> *in_stack_ffffffffffffff48;
  uint32 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  size_type sVar12;
  uint32 local_90;
  pair<Clasp::Literal,_int> local_8c;
  uint32 local_84;
  ClauseHead *local_80;
  uint32 local_78;
  uint32 local_74;
  uint32 local_70;
  Antecedent in_stack_ffffffffffffff98;
  Antecedent in_stack_ffffffffffffffa0;
  Literal in_stack_ffffffffffffffa8;
  uint32 in_stack_ffffffffffffffac;
  reference in_stack_ffffffffffffffb0;
  size_type local_44;
  int local_3c;
  Antecedent local_30;
  Antecedent local_28;
  Antecedent local_20;
  Literal local_14;
  int local_10;
  int local_c;
  
  this_00 = (Solver *)
            SingleOwnerPtr<Clasp::DecisionHeuristic,_Clasp::DeleteObject>::operator->
                      ((SingleOwnerPtr<Clasp::DecisionHeuristic,_Clasp::DeleteObject> *)0x1eb045);
  pDVar6 = bk_lib::pod_vector<Clasp::Solver::DLevel,_std::allocator<Clasp::Solver::DLevel>_>::back
                     ((pod_vector<Clasp::Solver::DLevel,_std::allocator<Clasp::Solver::DLevel>_> *)
                      (in_RDI + 0x128));
  (*(*(_func_int ***)this_00)[8])(this_00,in_RDI,(ulong)(*(uint *)pDVar6 & 0x3fffffff));
  local_c = 0;
  local_10 = 0;
  Literal::Literal(&local_14);
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::assign
            ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (size_type)((ulong)in_stack_ffffffffffffff48 >> 0x20),
             (Literal *)CONCAT44(in_stack_ffffffffffffff44.rep_,in_stack_ffffffffffffff40));
  Antecedent::Antecedent(&local_20);
  Antecedent::Antecedent(&local_28);
  Antecedent::Antecedent(&local_30);
  uVar1 = *(ulong *)(in_RDI + 0x70);
  bk_lib::
  pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>::
  clear((pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
         *)(in_RDI + 0x1b0));
  while( true ) {
    iVar2 = local_10;
    local_3c = 0;
    pDVar7 = SingleOwnerPtr<Clasp::DecisionHeuristic,_Clasp::DeleteObject>::operator->
                       ((SingleOwnerPtr<Clasp::DecisionHeuristic,_Clasp::DeleteObject> *)0x1eb12e);
    (*pDVar7->_vptr_DecisionHeuristic[10])(pDVar7,in_RDI,in_RDI + 0x180,(ulong)local_14.rep_);
    local_44 = 0;
    while (sVar12 = local_44,
          sVar4 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size
                            ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                             (in_RDI + 0x180)), sVar12 != sVar4) {
      in_stack_ffffffffffffffb0 =
           bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                     ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                      (in_RDI + 0x180),local_44);
      Literal::var(in_stack_ffffffffffffffb0);
      in_stack_ffffffffffffffac =
           level((Solver *)CONCAT44(in_stack_ffffffffffffff44.rep_,in_stack_ffffffffffffff40),
                 (Var)((ulong)in_stack_ffffffffffffff38 >> 0x20));
      local_3c = (uint)(in_stack_ffffffffffffffac != 0) + local_3c;
      Literal::var(in_stack_ffffffffffffffb0);
      bVar3 = seen((Solver *)CONCAT44(in_stack_ffffffffffffff44.rep_,in_stack_ffffffffffffff40),
                   (Var)((ulong)in_stack_ffffffffffffff38 >> 0x20));
      if (!bVar3) {
        local_10 = local_10 + 1;
        Literal::var(in_stack_ffffffffffffffb0);
        in_stack_ffffffffffffff50 = in_stack_ffffffffffffffac;
        markSeen((Solver *)CONCAT44(in_stack_ffffffffffffff44.rep_,in_stack_ffffffffffffff40),
                 (Var)((ulong)in_stack_ffffffffffffff38 >> 0x20));
        in_stack_ffffffffffffffac = in_stack_ffffffffffffff50;
        uVar5 = decisionLevel((Solver *)0x1eb239);
        if (in_stack_ffffffffffffff50 == uVar5) {
          local_c = local_c + 1;
        }
        else {
          in_stack_ffffffffffffff48 = (pair<Clasp::Literal,_int> *)(in_RDI + 400);
          in_stack_ffffffffffffffa8 = Literal::operator~((Literal *)in_stack_ffffffffffffff38);
          bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                    ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                     CONCAT44(sVar12,in_stack_ffffffffffffff50),&in_stack_ffffffffffffff48->first);
          markLevel((Solver *)CONCAT44(in_stack_ffffffffffffff44.rep_,in_stack_ffffffffffffff40),
                    (uint32)((ulong)in_stack_ffffffffffffff38 >> 0x20));
        }
      }
      local_44 = local_44 + 1;
    }
    if (local_10 != iVar2) {
      Antecedent::Antecedent((Antecedent *)&stack0xffffffffffffffa0,(Constraint *)0x0);
    }
    if (local_3c != local_10) {
      Antecedent::Antecedent((Antecedent *)&stack0xffffffffffffff98,(Constraint *)0x0);
      local_28.data_ = in_stack_ffffffffffffff98.data_;
    }
    if (((uVar1 >> 0x25 & 3) != 0 && -1 < (int)((uint)(uVar1 >> 0x25) & 3)) &&
       ((bVar3 = Antecedent::isNull(&local_28), !bVar3 ||
        (bVar3 = Antecedent::isNull(&local_20), !bVar3)))) {
      otfs((Solver *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8.rep_),
           (Antecedent *)in_stack_ffffffffffffffa0.data_,
           (Antecedent *)in_stack_ffffffffffffff98.data_,
           (Literal)(uint32)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
           SUB41(local_14.rep_ >> 0x18,0));
    }
    while( true ) {
      pLVar8 = Assignment::last((Assignment *)0x1eb37e);
      Literal::var(pLVar8);
      bVar3 = seen((Solver *)CONCAT44(in_stack_ffffffffffffff44.rep_,in_stack_ffffffffffffff40),
                   (Var)((ulong)in_stack_ffffffffffffff38 >> 0x20));
      if (((bVar3 ^ 0xffU) & 1) == 0) break;
      Assignment::undoLast
                ((Assignment *)CONCAT44(in_stack_ffffffffffffff44.rep_,in_stack_ffffffffffffff40));
    }
    pLVar8 = Assignment::last((Assignment *)0x1eb3be);
    local_70 = pLVar8->rep_;
    local_14.rep_ = local_70;
    pAVar9 = reason(in_stack_ffffffffffffff38,in_stack_ffffffffffffff44);
    local_28.data_ = pAVar9->data_;
    Literal::var(&local_14);
    clearSeen((Solver *)CONCAT44(in_stack_ffffffffffffff44.rep_,in_stack_ffffffffffffff40),
              (Var)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    local_c = local_c + -1;
    if (local_c == 0) break;
    local_10 = local_10 + -1;
    local_30.data_ = local_28.data_;
    local_74 = local_14.rep_;
    reason(this_00,(Literal)(uint32)((ulong)in_RDI >> 0x20),
           (LitVec *)CONCAT44(sVar12,in_stack_ffffffffffffff50));
  }
  local_78 = (uint32)Literal::operator~((Literal *)in_stack_ffffffffffffff38);
  pLVar10 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                      ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 400)
                       ,0);
  pLVar10->rep_ = local_78;
  local_80 = (ClauseHead *)0x0;
  if ((1 < ((uint)((ulong)*(undefined8 *)(in_RDI + 0x70) >> 0x25) & 3)) ||
     (bVar3 = Antecedent::isNull(&local_20), !bVar3)) {
    bVar3 = Antecedent::isNull(&local_20);
    if (bVar3) {
      in_stack_ffffffffffffff44.rep_ =
           bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size
                     ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 400))
      ;
      sVar4 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size
                        ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                         (in_RDI + 0x180));
      if (in_stack_ffffffffffffff44.rep_ <= sVar4 + 1) {
        local_80 = Clasp::clause((Antecedent *)
                                 CONCAT44(in_stack_ffffffffffffff44.rep_,in_stack_ffffffffffffff40))
        ;
      }
    }
    else {
      local_80 = Clasp::clause((Antecedent *)
                               CONCAT44(in_stack_ffffffffffffff44.rep_,in_stack_ffffffffffffff40));
    }
  }
  if ((*(ulong *)(in_RDI + 0x70) >> 0x32 & 1) != 0) {
    local_84 = local_14.rep_;
    reason(in_stack_ffffffffffffff38,in_stack_ffffffffffffff44);
    bVar3 = Antecedent::learnt((Antecedent *)
                               CONCAT44(in_stack_ffffffffffffff44.rep_,in_stack_ffffffffffffff40));
    if (bVar3) {
      pAVar9 = reason((Solver *)(in_RDI + 0x1b0),in_stack_ffffffffffffff44);
      pCVar11 = Antecedent::constraint(pAVar9);
      (*pCVar11->_vptr_Constraint[0xc])();
      local_90 = ConstraintScore::lbd
                           ((ConstraintScore *)
                            CONCAT44(in_stack_ffffffffffffff44.rep_,in_stack_ffffffffffffff40));
      std::pair<Clasp::Literal,_int>::pair<Clasp::Literal_&,_unsigned_int,_true>
                (&local_8c,&local_14,&local_90);
      bk_lib::
      pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>::
      push_back((pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                 *)CONCAT44(sVar12,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48);
    }
  }
  uVar5 = simplifyConflictClause
                    (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008);
  return uVar5;
}

Assistant:

uint32 Solver::analyzeConflict() {
	// must be called here, because we unassign vars during analyzeConflict
	heuristic_->undoUntil( *this, levels_.back().trailPos );
	uint32 onLevel  = 0;        // number of literals from the current DL in resolvent
	uint32 resSize  = 0;        // size of current resolvent
	Literal p;                  // literal to be resolved out next
	cc_.assign(1, p);           // will later be replaced with asserting literal
	Antecedent lhs, rhs, last;  // resolve operands
	const bool doOtfs = strategy_.otfs > 0;
	for (bumpAct_.clear();;) {
		uint32 lhsSize = resSize;
		uint32 rhsSize = 0;
		heuristic_->updateReason(*this, conflict_, p);
		for (LitVec::size_type i = 0; i != conflict_.size(); ++i) {
			Literal& q = conflict_[i];
			uint32 cl  = level(q.var());
			rhsSize   += (cl != 0);
			if (!seen(q.var())) {
				++resSize;
				assert(isTrue(q) && "Invalid literal in reason set!");
				assert(cl > 0 && "Top-Level implication not marked!");
				markSeen(q.var());
				if (cl == decisionLevel()) {
					++onLevel;
				}
				else {
					cc_.push_back(~q);
					markLevel(cl);
				}
			}
		}
		if (resSize != lhsSize) { lhs = 0; }
		if (rhsSize != resSize) { rhs = 0; }
		if (doOtfs && (!rhs.isNull() || !lhs.isNull())) {
			// resolvent subsumes rhs and possibly also lhs
			otfs(lhs, rhs, p, onLevel == 1);
		}
		assert(onLevel > 0 && "CONFLICT MUST BE ANALYZED ON CONFLICT LEVEL!");
		// search for the last assigned literal that needs to be analyzed...
		while (!seen(assign_.last().var())) {
			assign_.undoLast();
		}
		p   = assign_.last();
		rhs = reason(p);
		clearSeen(p.var());
		if (--onLevel == 0) {
			break;
		}
		--resSize; // p will be resolved out next
		last = rhs;
		reason(p, conflict_);
	}
	cc_[0] = ~p; // store the 1-UIP
	assert(decisionLevel() == level(cc_[0].var()));
	ClauseHead* lastRes = 0;
	if (strategy_.otfs > 1 || !lhs.isNull()) {
		if (!lhs.isNull()) {
			lastRes = clause(lhs);
		}
		else if (cc_.size() <= (conflict_.size()+1)) {
			lastRes = clause(last);
		}
	}
	if (strategy_.bumpVarAct && reason(p).learnt()) {
		bumpAct_.push_back(WeightLiteral(p, reason(p).constraint()->activity().lbd()));
	}
	return simplifyConflictClause(cc_, ccInfo_, lastRes);
}